

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O2

base_learner * binary_setup(options_i *options,vw *all)

{
  base_learner *l;
  single_learner *base;
  learner<char,_example> *plVar1;
  bool binary;
  option_group_definition new_options;
  bool local_1eb;
  allocator local_1ea;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8;
  string local_1a8;
  option_group_definition local_188;
  undefined1 local_150 [112];
  bool local_e0;
  typed_option<bool> local_b0;
  
  local_1eb = false;
  std::__cxx11::string::string((string *)&local_1a8,"Binary loss",(allocator *)local_150);
  VW::config::option_group_definition::option_group_definition(&local_188,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,"binary",&local_1e9);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_150,&local_1c8,&local_1eb);
  local_e0 = true;
  std::__cxx11::string::string(local_1e8,"report loss as binary classification on -1,1",&local_1ea);
  std::__cxx11::string::_M_assign((string *)(local_150 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_b0,(typed_option<bool> *)local_150);
  VW::config::option_group_definition::add<bool>(&local_188,&local_b0);
  VW::config::typed_option<bool>::~typed_option(&local_b0);
  std::__cxx11::string::~string(local_1e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_150);
  std::__cxx11::string::~string((string *)&local_1c8);
  (**options->_vptr_options_i)(options,&local_188);
  if (local_1eb == false) {
    plVar1 = (learner<char,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar1 = LEARNER::init_learner<char,example,LEARNER::learner<char,example>>
                       (base,predict_or_learn<true>,predict_or_learn<false>);
  }
  VW::config::option_group_definition::~option_group_definition(&local_188);
  return (base_learner *)plVar1;
}

Assistant:

LEARNER::base_learner* binary_setup(options_i& options, vw& all)
{
  bool binary = false;
  option_group_definition new_options("Binary loss");
  new_options.add(make_option("binary", binary).keep().help("report loss as binary classification on -1,1"));
  options.add_and_parse(new_options);

  if (!binary)
    return nullptr;

  LEARNER::learner<char, example>& ret =
      LEARNER::init_learner(as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  return make_base(ret);
}